

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day14a.cpp
# Opt level: O0

void day14a::run(void)

{
  uint32_t uVar1;
  ostream *poVar2;
  allocator local_61;
  string local_60;
  allocator local_29;
  string local_28;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"day14a ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_28,"ahsbgdzn",&local_29);
  uVar1 = get_index(&local_28,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  poVar2 = std::operator<<((ostream *)&std::cout,"day14b ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"ahsbgdzn",&local_61);
  uVar1 = get_index(&local_60,0x7e0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

void run() {
		std::cout << "day14a " << get_index("ahsbgdzn", 0) << '\n';
		std::cout << "day14b " << get_index("ahsbgdzn", 2016) << '\n';
		//std::cout << "day14a " << get_index("abc", 0) << '\n';
		//std::cout << "day14a " << get_index("abc", 2016) << '\n';
	}